

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleSequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleSequenceExprSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::SequenceRepetitionSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,SequenceRepetitionSyntax **args_1)

{
  SequenceRepetitionSyntax *repetition;
  ExpressionSyntax *in_RDX;
  SimpleSequenceExprSyntax *in_RSI;
  BumpAllocator *in_RDI;
  
  repetition = (SequenceRepetitionSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::SimpleSequenceExprSyntax::SimpleSequenceExprSyntax(in_RSI,in_RDX,repetition);
  return (SimpleSequenceExprSyntax *)repetition;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }